

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_circle_sector
               (rf_vec2 center,float radius,int start_angle,int end_angle,int segments,
               rf_color color)

{
  _Bool _Var1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 local_78;
  undefined1 local_74;
  undefined4 local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  
  iVar4 = start_angle;
  if (start_angle < end_angle) {
    iVar4 = end_angle;
  }
  fVar9 = (float)(~-(uint)(0.0 < radius) & 0x3dcccccd | (uint)radius & -(uint)(0.0 < radius));
  if (end_angle < start_angle) {
    start_angle = end_angle;
  }
  if (segments < 4) {
    fVar7 = -0.5 / fVar9 + 1.0;
    fVar7 = fVar7 * fVar7;
    fVar7 = acosf(fVar7 + fVar7 + -1.0);
    local_78 = (float)(iVar4 - start_angle);
    fVar7 = ceilf(6.2831855 / fVar7);
    uVar2 = (uint)((fVar7 * local_78) / 360.0);
    uVar5 = 4;
    if (0 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
  }
  else {
    uVar5 = (ulong)(uint)segments;
    local_78 = (float)(iVar4 - start_angle);
  }
  iVar4 = (int)uVar5;
  _Var1 = rf_gfx_check_buffer_limit(iVar4 * 3);
  if (_Var1) {
    rf_gfx_draw();
  }
  local_70 = (float)start_angle;
  rf_gfx_begin(RF_TRIANGLES);
  uStack_64 = center.y;
  uVar3 = 0;
  if (0 < iVar4) {
    uVar3 = uVar5;
  }
  local_74 = color.g;
  while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
    rf_gfx_color4ub(color.r,local_74,color.b,color.a);
    local_68 = center.x;
    rf_gfx_vertex2f(local_68,uStack_64);
    fVar7 = sinf(local_70 * 0.017453292);
    fVar8 = cosf(local_70 * 0.017453292);
    rf_gfx_vertex2f(fVar7 * fVar9 + local_68,fVar8 * fVar9 + uStack_64);
    local_70 = local_70 + local_78 / (float)iVar4;
    fVar7 = sinf(local_70 * 0.017453292);
    fVar8 = cosf(local_70 * 0.017453292);
    rf_gfx_vertex2f(fVar7 * fVar9 + local_68,fVar8 * fVar9 + uStack_64);
  }
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_circle_sector(rf_vec2 center, float radius, int start_angle, int end_angle, int segments, rf_color color)
{
    if (radius <= 0.0f) radius = 0.1f; // Avoid div by zero

    // Function expects (endAngle > start_angle)
    if (end_angle < start_angle)
    {
        // Swap values
        int tmp = start_angle;
        start_angle = end_angle;
        end_angle = tmp;
    }

    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088
        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (end_angle - start_angle) * ceilf(2 * RF_PI / th) / 360;

        if (segments <= 0) segments = 4;
    }

    float step_length = (float)(end_angle - start_angle)/(float)segments;
    float angle = start_angle;
    if (rf_gfx_check_buffer_limit(3*segments)) rf_gfx_draw();

    rf_gfx_begin(RF_TRIANGLES);
    for (rf_int i = 0; i < segments; i++)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex2f(center.x, center.y);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*radius, center.y + cosf(RF_DEG2RAD*angle)*radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*radius);

        angle += step_length;
    }
    rf_gfx_end();
}